

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,TPZGeoElRefLess<pzgeom::TPZGeoPoint> *gel)

{
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide TStack_48;
  TPZGeoElSide local_30;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b73c8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b7020,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b6d20;
  (this->fGeo).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c2980;
  (this->fGeo).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0] =
       (gel->fGeo).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoPoint_016c28f8;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_016b1180;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZGeoElSide::TPZGeoElSide(&local_30,this->fNeighbours,(this->super_TPZGeoEl).fMesh);
  TPZGeoElSide::TPZGeoElSide(&TStack_48,gel->fNeighbours,(this->super_TPZGeoEl).fMesh);
  TPZGeoElSide::SetConnectivity(&local_30,&TStack_48);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}